

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_symbol_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar2;
  JSValue local_38;
  
  v = js_thisSymbolValue(ctx,this_val);
  JVar2 = v;
  if ((((uint)v.tag != 6) &&
      (local_38 = v, JVar2 = js_string_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,&local_38),
      0xfffffff4 < (uint)v.tag)) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  return JVar2;
}

Assistant:

static JSValue js_symbol_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue val, ret;
    val = js_thisSymbolValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    /* XXX: use JS_ToStringInternal() with a flags */
    ret = js_string_constructor(ctx, JS_UNDEFINED, 1, (JSValueConst *)&val);
    JS_FreeValue(ctx, val);
    return ret;
}